

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O2

char * search_header(curl_slist *hdrlist,char *hdr)

{
  size_t len;
  char *pcVar1;
  
  len = strlen(hdr);
  pcVar1 = (char *)0x0;
  for (; (pcVar1 == (char *)0x0 && (hdrlist != (curl_slist *)0x0)); hdrlist = hdrlist->next) {
    pcVar1 = match_header(hdrlist,hdr,len);
  }
  return pcVar1;
}

Assistant:

static char *search_header(struct curl_slist *hdrlist, const char *hdr)
{
  size_t len = strlen(hdr);
  char *value = NULL;

  for(; !value && hdrlist; hdrlist = hdrlist->next)
    value = match_header(hdrlist, hdr, len);

  return value;
}